

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# whisper.cpp
# Opt level: O0

void whisper_reset_timings(whisper_context *ctx)

{
  undefined8 uVar1;
  long in_RDI;
  
  uVar1 = ggml_time_us();
  *(undefined8 *)(in_RDI + 8) = uVar1;
  if (*(long *)(in_RDI + 0x220) != 0) {
    *(undefined8 *)(*(long *)(in_RDI + 0x220) + 0x28) = 0;
    **(undefined8 **)(in_RDI + 0x220) = 0;
    *(undefined8 *)(*(long *)(in_RDI + 0x220) + 8) = 0;
    *(undefined8 *)(*(long *)(in_RDI + 0x220) + 0x10) = 0;
    *(undefined8 *)(*(long *)(in_RDI + 0x220) + 0x18) = 0;
    *(undefined8 *)(*(long *)(in_RDI + 0x220) + 0x20) = 0;
    *(undefined4 *)(*(long *)(in_RDI + 0x220) + 0x30) = 0;
    *(undefined4 *)(*(long *)(in_RDI + 0x220) + 0x34) = 0;
    *(undefined4 *)(*(long *)(in_RDI + 0x220) + 0x38) = 0;
    *(undefined4 *)(*(long *)(in_RDI + 0x220) + 0x3c) = 0;
    *(undefined4 *)(*(long *)(in_RDI + 0x220) + 0x40) = 0;
  }
  return;
}

Assistant:

void whisper_reset_timings(struct whisper_context * ctx) {
    ctx->t_start_us = ggml_time_us();
    if (ctx->state != nullptr) {
        ctx->state->t_mel_us = 0;
        ctx->state->t_sample_us = 0;
        ctx->state->t_encode_us = 0;
        ctx->state->t_decode_us = 0;
        ctx->state->t_batchd_us = 0;
        ctx->state->t_prompt_us = 0;
        ctx->state->n_sample = 0;
        ctx->state->n_encode = 0;
        ctx->state->n_decode = 0;
        ctx->state->n_batchd = 0;
        ctx->state->n_prompt = 0;
    }
}